

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O2

void __thiscall QHttp2Connection::handleSETTINGS(QHttp2Connection *this)

{
  QHttp2Connection *this_00;
  bool bVar1;
  Settings identifier;
  quint32 qVar2;
  FrameFlags FVar3;
  ushort *puVar4;
  char *message;
  uint uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  Http2Error HStack_60;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this + 0x238;
  qVar2 = Http2::Frame::streamID((Frame *)this_00);
  if (qVar2 != 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001d87d8;
    message = "SETTINGS on invalid stream";
LAB_001d85bd:
    HStack_60 = PROTOCOL_ERROR;
LAB_001d85bf:
    connectionError(this,HStack_60,message);
    return;
  }
  FVar3 = Http2::Frame::flags((Frame *)this_00);
  if (((uint)FVar3.super_QFlagsStorageHelper<Http2::FrameFlag,_4>.
             super_QFlagsStorage<Http2::FrameFlag>.i & 1) == 0) {
    qHttp2ConnectionLog();
    if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
        != 0) {
      local_58[0] = '\x02';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      local_58[0x10] = '\0';
      local_58[0x11] = '\0';
      local_58[0x12] = '\0';
      local_58[0x13] = '\0';
      local_58[0x14] = '\0';
      local_58[0x15] = '\0';
      local_58[0x16] = '\0';
      local_58[0x17] = '\0';
      local_40 = qHttp2ConnectionLog::category.name;
      QMessageLogger::debug(local_58,"[%p] Received SETTINGS frame",this);
    }
    qVar2 = Http2::Frame::dataSize((Frame *)this_00);
    if (qVar2 == 0) {
LAB_001d8703:
      qHttp2ConnectionLog();
      if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
          != 0) {
        local_58[0] = '\x02';
        local_58[1] = '\0';
        local_58[2] = '\0';
        local_58[3] = '\0';
        local_58[4] = '\0';
        local_58[5] = '\0';
        local_58[6] = '\0';
        local_58[7] = '\0';
        local_58[8] = '\0';
        local_58[9] = '\0';
        local_58[10] = '\0';
        local_58[0xb] = '\0';
        local_58[0xc] = '\0';
        local_58[0xd] = '\0';
        local_58[0xe] = '\0';
        local_58[0xf] = '\0';
        local_58[0x10] = '\0';
        local_58[0x11] = '\0';
        local_58[0x12] = '\0';
        local_58[0x13] = '\0';
        local_58[0x14] = '\0';
        local_58[0x15] = '\0';
        local_58[0x16] = '\0';
        local_58[0x17] = '\0';
        local_40 = qHttp2ConnectionLog::category.name;
        QMessageLogger::debug(local_58,"[%p] Sending SETTINGS ACK",this);
      }
      sendSETTINGS_ACK(this);
      settingsFrameReceived(this);
    }
    else {
      puVar4 = (ushort *)Http2::Frame::dataBegin((Frame *)this_00);
      qVar2 = Http2::Frame::dataSize((Frame *)this_00);
      uVar6 = (ulong)qVar2;
      do {
        if (uVar6 == 0) goto LAB_001d8703;
        identifier = *puVar4 << 8 | *puVar4 >> 8;
        uVar5 = *(uint *)(puVar4 + 1);
        uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        bVar1 = acceptSetting(this,identifier,uVar5);
        puVar4 = puVar4 + 3;
        uVar6 = uVar6 - 6;
      } while (bVar1);
      qHttp2ConnectionLog();
      if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
          != 0) {
        local_58[0] = '\x02';
        local_58[1] = '\0';
        local_58[2] = '\0';
        local_58[3] = '\0';
        local_58[4] = '\0';
        local_58[5] = '\0';
        local_58[6] = '\0';
        local_58[7] = '\0';
        local_58[8] = '\0';
        local_58[9] = '\0';
        local_58[10] = '\0';
        local_58[0xb] = '\0';
        local_58[0xc] = '\0';
        local_58[0xd] = '\0';
        local_58[0xe] = '\0';
        local_58[0xf] = '\0';
        local_58[0x10] = '\0';
        local_58[0x11] = '\0';
        local_58[0x12] = '\0';
        local_58[0x13] = '\0';
        local_58[0x14] = '\0';
        local_58[0x15] = '\0';
        local_58[0x16] = '\0';
        local_58[0x17] = '\0';
        local_40 = qHttp2ConnectionLog::category.name;
        QMessageLogger::debug
                  (local_58,"[%p] Received an unacceptable setting, %u, %u",this,(ulong)identifier,
                   (ulong)uVar5);
      }
    }
  }
  else {
    qVar2 = Http2::Frame::payloadSize((Frame *)this_00);
    if (qVar2 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001d87d8;
      message = "SETTINGS ACK with data";
      HStack_60 = FRAME_SIZE_ERROR;
      goto LAB_001d85bf;
    }
    if (this[0x14] == (QHttp2Connection)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001d87d8;
      message = "unexpected SETTINGS ACK";
      goto LAB_001d85bd;
    }
    qHttp2ConnectionLog();
    if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
        != 0) {
      local_58[0] = '\x02';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      local_58[0x10] = '\0';
      local_58[0x11] = '\0';
      local_58[0x12] = '\0';
      local_58[0x13] = '\0';
      local_58[0x14] = '\0';
      local_58[0x15] = '\0';
      local_58[0x16] = '\0';
      local_58[0x17] = '\0';
      local_40 = qHttp2ConnectionLog::category.name;
      QMessageLogger::debug(local_58,"[%p] Received SETTINGS ACK",this);
    }
    this[0x14] = (QHttp2Connection)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001d87d8:
  __stack_chk_fail();
}

Assistant:

void QHttp2Connection::handleSETTINGS()
{
    // 6.5 SETTINGS.
    Q_ASSERT(inboundFrame.type() == FrameType::SETTINGS);

    // RFC 9113, 6.5: If an endpoint receives a SETTINGS frame whose Stream Identifier field is
    // anything other than 0x00, the endpoint MUST respond with a connection error
    if (inboundFrame.streamID() != connectionStreamID)
        return connectionError(PROTOCOL_ERROR, "SETTINGS on invalid stream");

    if (inboundFrame.flags().testFlag(FrameFlag::ACK)) {
        // RFC 9113, 6.5: Receipt of a SETTINGS frame with the ACK flag set and a length field
        // value other than 0 MUST be treated as a connection error
        if (inboundFrame.payloadSize ())
            return connectionError(FRAME_SIZE_ERROR, "SETTINGS ACK with data");
        if (!waitingForSettingsACK)
            return connectionError(PROTOCOL_ERROR, "unexpected SETTINGS ACK");
        qCDebug(qHttp2ConnectionLog, "[%p] Received SETTINGS ACK", this);
        waitingForSettingsACK = false;
        return;
    }
    qCDebug(qHttp2ConnectionLog, "[%p] Received SETTINGS frame", this);

    if (inboundFrame.dataSize()) {
        // RFC 9113, 6.5: A SETTINGS frame with a length other than a multiple of 6 octets MUST be
        // treated as a connection error (Section 5.4.1) of type FRAME_SIZE_ERROR.
        // checked in Frame::validateHeader()
        Q_ASSERT (inboundFrame.payloadSize() % 6 == 0);

        auto src = inboundFrame.dataBegin();
        for (const uchar *end = src + inboundFrame.dataSize(); src != end; src += 6) {
            const Settings identifier = Settings(qFromBigEndian<quint16>(src));
            const quint32 intVal = qFromBigEndian<quint32>(src + 2);
            if (!acceptSetting(identifier, intVal)) {
                // If not accepted - we finish with connectionError.
                qCDebug(qHttp2ConnectionLog, "[%p] Received an unacceptable setting, %u, %u", this,
                        quint32(identifier), intVal);
                return; // connectionError already called in acceptSetting.
            }
        }
    }

    qCDebug(qHttp2ConnectionLog, "[%p] Sending SETTINGS ACK", this);
    sendSETTINGS_ACK();
    emit settingsFrameReceived();
}